

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int externalSubset1(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  code *pcVar2;
  
  iVar1 = 0;
  if (tok < 0x1a) {
    if (tok == -4) {
      if (state->includeLevel == 0) {
        return iVar1;
      }
      goto LAB_0015f92f;
    }
    if (tok == 0xf) {
      return iVar1;
    }
  }
  else {
    if (tok == 0x1a) {
LAB_0015f92f:
      state->handler = error;
      return -1;
    }
    if (tok == 0x22) {
      if (state->includeLevel != 0) {
        state->includeLevel = state->includeLevel - 1;
        return iVar1;
      }
      goto LAB_0015f92f;
    }
    if (tok == 0x21) {
      state->handler = condSect0;
      return 0;
    }
  }
  iVar1 = 0;
  switch(tok) {
  case 0xb:
  case 0xd:
  case 0xf:
    goto switchD_0015f388_caseD_b;
  case 0xc:
  case 0xe:
    goto switchD_0015f388_caseD_c;
  case 0x10:
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"ENTITY");
    if (iVar1 != 0) {
      pcVar2 = entity0;
LAB_0015f497:
      state->handler = pcVar2;
      return 0;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"ATTLIST");
    if (iVar1 != 0) {
      pcVar2 = attlist0;
      goto LAB_0015f497;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"ELEMENT");
    if (iVar1 != 0) {
      pcVar2 = element0;
      goto LAB_0015f497;
    }
    iVar1 = (*enc->nameMatchesAscii)(enc,ptr + (long)enc->minBytesPerChar * 2,end,"NOTATION");
    if (iVar1 != 0) {
      pcVar2 = notation0;
      goto LAB_0015f497;
    }
    goto LAB_0015f3e5;
  default:
    if (tok == 0x1a) {
      pcVar2 = doctype5;
      goto LAB_0015f497;
    }
    if (tok == 0x1c) {
      return 0x35;
    }
switchD_0015f388_caseD_c:
    if ((tok != 0x1c) || (iVar1 = 0x34, state->documentEntity != 0)) {
LAB_0015f3e5:
      state->handler = error;
      iVar1 = -1;
    }
switchD_0015f388_caseD_b:
    return iVar1;
  }
}

Assistant:

static
int externalSubset1(PROLOG_STATE *state,
                    int tok,
                    const char *ptr,
                    const char *end,
                    const ENCODING *enc)
{
  switch (tok) {
  case XML_TOK_COND_SECT_OPEN:
    state->handler = condSect0;
    return XML_ROLE_NONE;
  case XML_TOK_COND_SECT_CLOSE:
    if (state->includeLevel == 0)
      break;
    state->includeLevel -= 1;
    return XML_ROLE_NONE;
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_CLOSE_BRACKET:
    break;
  case XML_TOK_NONE:
    if (state->includeLevel)
      break;
    return XML_ROLE_NONE;
  default:
    return internalSubset(state, tok, ptr, end, enc);
  }
  return common(state, tok);
}